

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

bool __thiscall
ON_SubDMeshFragment::ReserveManagedVertexCapacity(ON_SubDMeshFragment *this,size_t vertex_capacity)

{
  bool bVar1;
  
  if ((vertex_capacity < 0x1001) && (bVar1 = UnmanagedArrays(this), !bVar1)) {
    bVar1 = ManagedArrays(this);
    if (bVar1) {
      if (vertex_capacity <= (this->m_vertex_capacity_etc & 0x1fff)) {
        return true;
      }
      DeleteManagedArrays(this);
    }
    Internal_LayoutArrays(this,vertex_capacity,(double *)0x0);
    return vertex_capacity <= (this->m_vertex_capacity_etc & 0x1fff);
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubDMeshFragment::ReserveManagedVertexCapacity(size_t vertex_capacity)
{
  if (vertex_capacity < 0 || vertex_capacity >(size_t)ON_SubDMeshFragment::MaximumVertexCount)
    return ON_SUBD_RETURN_ERROR(false);
  if (vertex_capacity > (size_t)(ON_SubDMeshFragment::ValueMask))
    return ON_SUBD_RETURN_ERROR(false); // too big
  if (UnmanagedArrays())
  {
    // attempting to convert externally managed memory to internally managed memory.
    return ON_SUBD_RETURN_ERROR(false);
  }
  const size_t current_capacity = (size_t)(ON_SubDMeshFragment::ValueMask & m_vertex_capacity_etc);
  if (ManagedArrays())
  {
    if (current_capacity >= vertex_capacity)
      return true;
    DeleteManagedArrays();
  }

  Internal_LayoutArrays( vertex_capacity, nullptr );
  return (this->VertexCapacity() >= vertex_capacity);
}